

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

DynamicType * __thiscall
Js::PathTypeHandlerBase::PromoteType<true>
          (PathTypeHandlerBase *this,DynamicType *predecessorType,PathTypeSuccessorKey key,
          bool shareType,ScriptContext *scriptContext,DynamicObject *instance,
          PropertyIndex *propertyIndex)

{
  code *pcVar1;
  Type TVar2;
  DynamicObject *this_00;
  bool bVar3;
  byte bVar4;
  uint8 uVar5;
  uint8 uVar6;
  ObjectSlotAttributes OVar7;
  PropertyTypes PVar8;
  BYTE values;
  bool bVar9;
  uint16 uVar10;
  PropertyIndex PVar11;
  PropertyId PVar12;
  int iVar13;
  uint uVar14;
  BOOL BVar15;
  undefined4 *puVar16;
  TypePath *pTVar17;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectSlotAttributes *pOVar18;
  PathTypeSetterSlotIndex *pPVar19;
  DynamicTypeHandler *pDVar20;
  unsigned_short *puVar21;
  int *piVar22;
  Recycler *alloc;
  DynamicType *pDVar23;
  RecyclerWeakReference<Js::DynamicType> *typeWeakRef;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_01;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *this_02;
  PathTypeHandlerBase *pPVar24;
  byte local_235;
  byte local_199;
  byte local_181;
  char16_t *local_180;
  bool local_169;
  undefined1 local_158 [23];
  PropertyAttributes local_141;
  PathTypeSuccessorKey PStack_140;
  PropertyAttributes isWritableAttribute;
  code *local_138;
  Type local_130;
  TrackAllocData local_128;
  int local_fc;
  PathTypeSetterSlotIndex local_f6;
  byte local_f5;
  uint16 local_f4;
  uint16 local_f2;
  unsigned_short local_f0;
  PathTypeSetterSlotIndex newSetterCount;
  bool markTypeAsShared;
  uint16 newOffsetOfInlineSlots;
  PropertyIndex newInlineSlotCapacity;
  PropertyIndex newSlotCapacity;
  PropertyIndex newPropertyCount;
  Type TStack_e8;
  bool isSetterProperty;
  DynamicType *currPredecessorType;
  TypePath *oldTypePath;
  PathTypeHandlerBase *typeHandlerToUpdate;
  RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstance;
  DynamicType *oldType;
  bool growing;
  Type TStack_b8;
  bool branching;
  PathTypeSetterSlotIndex *newSetters;
  PathTypeSetterSlotIndex *oldSetters;
  ObjectSlotAttributes *newAttributes;
  ObjectSlotAttributes *oldAttributes;
  Type TStack_90;
  uint8 oldPathSize;
  TypePath *newTypePath;
  Type local_80;
  PathTypeHandlerBase *nextPath;
  PropertyRecord *propertyRecord;
  RecyclerWeakReference<Js::DynamicType> *nextTypeWeakRef;
  DynamicType *nextType;
  Type TStack_58;
  PropertyIndex index;
  Recycler *recycler;
  JavascriptLibrary *library;
  DynamicObject *instance_local;
  ScriptContext *scriptContext_local;
  Type TStack_30;
  bool shareType_local;
  DynamicType *predecessorType_local;
  PathTypeHandlerBase *this_local;
  PathTypeSuccessorKey key_local;
  
  library = (JavascriptLibrary *)instance;
  instance_local = (DynamicObject *)scriptContext;
  scriptContext_local._7_1_ = shareType;
  TStack_30.ptr = (RuntimeFunction *)predecessorType;
  predecessorType_local = (DynamicType *)this;
  this_local = (PathTypeHandlerBase *)key;
  if (propertyIndex == (PropertyIndex *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x7d1,"(propertyIndex != nullptr)","propertyIndex != nullptr");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 0;
  }
  recycler = (Recycler *)ScriptContext::GetLibrary((ScriptContext *)instance_local);
  TStack_58.ptr = (RuntimeFunction *)ScriptContext::GetRecycler((ScriptContext *)instance_local);
  this_00 = instance_local;
  propertyRecord = (PropertyRecord *)0x0;
  PVar12 = PathTypeSuccessorKey::GetPropertyId((PathTypeSuccessorKey *)&this_local);
  nextPath = (PathTypeHandlerBase *)ScriptContext::GetPropertyName((ScriptContext *)this_00,PVar12);
  newTypePath = (TypePath *)this_local;
  bVar3 = GetSuccessor(this,(PathTypeSuccessorKey)this_local,
                       (RecyclerWeakReference<Js::DynamicType> **)&propertyRecord);
  if ((bVar3) &&
     (nextTypeWeakRef =
           (RecyclerWeakReference<Js::DynamicType> *)
           Memory::RecyclerWeakReference<Js::DynamicType>::Get
                     ((RecyclerWeakReference<Js::DynamicType> *)propertyRecord),
     (DynamicType *)nextTypeWeakRef != (DynamicType *)0x0)) {
    *(int *)&instance_local[0x31].super_RecyclableObject.type.ptr =
         *(int *)&instance_local[0x31].super_RecyclableObject.type.ptr + 1;
    local_80.ptr = (RuntimeFunction *)DynamicType::GetTypeHandler((DynamicType *)nextTypeWeakRef);
    bVar3 = DynamicTypeHandler::GetIsInlineSlotCapacityLocked((DynamicTypeHandler *)local_80.ptr);
    bVar9 = DynamicTypeHandler::GetIsInlineSlotCapacityLocked(&this->super_DynamicTypeHandler);
    if (bVar3 != bVar9) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x8c3,
                                  "(nextPath->GetIsInlineSlotCapacityLocked() == this->GetIsInlineSlotCapacityLocked())"
                                  ,
                                  "nextPath->GetIsInlineSlotCapacityLocked() == this->GetIsInlineSlotCapacityLocked()"
                                 );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
    iVar13 = (*(((PathTypeHandlerNoAttr *)&(local_80.ptr)->super_JavascriptFunction)->
               super_PathTypeHandlerBase).super_DynamicTypeHandler._vptr_DynamicTypeHandler[0xc])
                       (local_80.ptr,nextPath);
    nextType._6_2_ = (PropertyIndex)iVar13;
    bVar3 = FixPropsOnPathTypes();
    if (((!bVar3) ||
        (bVar3 = DynamicTypeHandler::GetMayBecomeShared((DynamicTypeHandler *)local_80.ptr), !bVar3)
        ) && ((bVar3 = DynamicTypeHandler::GetIsShared((DynamicTypeHandler *)local_80.ptr), !bVar3
              || (bVar3 = DynamicType::GetIsShared((DynamicType *)nextTypeWeakRef), !bVar3)))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x8c8,
                                  "((FixPropsOnPathTypes() && nextPath->GetMayBecomeShared()) || (nextPath->GetIsShared() && nextType->GetIsShared()))"
                                  ,
                                  "(FixPropsOnPathTypes() && nextPath->GetMayBecomeShared()) || (nextPath->GetIsShared() && nextType->GetIsShared())"
                                 );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
    bVar3 = FixPropsOnPathTypes();
    if ((bVar3) && (bVar3 = DynamicType::GetIsShared((DynamicType *)nextTypeWeakRef), !bVar3)) {
      bVar3 = DynamicTypeHandler::GetIsShared((DynamicTypeHandler *)local_80.ptr);
      TVar2.ptr = local_80.ptr;
      if (!bVar3) {
        PVar12 = PropertyRecord::GetPropertyId((PropertyRecord *)nextPath);
        AddBlankFieldAt((PathTypeHandlerBase *)TVar2.ptr,PVar12,nextType._6_2_,
                        (ScriptContext *)instance_local);
        DoShareTypeHandlerInternal<true>
                  ((PathTypeHandlerBase *)local_80.ptr,(ScriptContext *)instance_local);
      }
      DynamicType::ShareType((DynamicType *)nextTypeWeakRef);
    }
  }
  else {
    TStack_90.ptr = (RuntimeFunction *)GetTypePath(this);
    pTVar17 = GetTypePath(this);
    oldAttributes._7_1_ = TypePath::GetPathSize(pTVar17);
    iVar13 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])();
    oldSetters = (PathTypeSetterSlotIndex *)CONCAT44(extraout_var,iVar13);
    newAttributes = oldSetters;
    iVar13 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6f])();
    TStack_b8.ptr = (RuntimeFunction *)CONCAT44(extraout_var_00,iVar13);
    newSetters = (PathTypeSetterSlotIndex *)TStack_b8.ptr;
    pTVar17 = GetTypePath(this);
    bVar4 = TypePath::GetPathLength(pTVar17);
    uVar10 = GetPathLength(this);
    oldType._7_1_ = uVar10 < bVar4;
    local_169 = false;
    if (!(bool)oldType._7_1_) {
      pTVar17 = GetTypePath(this);
      uVar5 = TypePath::GetPathLength(pTVar17);
      pTVar17 = GetTypePath(this);
      uVar6 = TypePath::GetPathSize(pTVar17);
      local_169 = uVar5 == uVar6;
    }
    oldType._6_1_ = local_169;
    oldSingletonInstance = (RecyclerWeakReference<Js::DynamicObject> *)TStack_30.ptr;
    typeHandlerToUpdate = (PathTypeHandlerBase *)GetSingletonInstance(this);
    if ((oldType._7_1_ & 1) == 0) {
      local_180 = L"advancing";
    }
    else {
      local_180 = L"branching";
    }
    TraceFixedFieldsBeforeTypeHandlerChange
              (local_180,L"PathTypeHandler",L"PathTypeHandler",(DynamicObject *)library,
               &this->super_DynamicTypeHandler,(DynamicType *)oldSingletonInstance,
               (RecyclerWeakReference<Js::DynamicObject> *)typeHandlerToUpdate);
    if ((oldType._7_1_ & 1) == 0) {
      if ((oldType._6_1_ & 1) == 0) {
        OVar7 = PathTypeSuccessorKey::GetAttributes((PathTypeSuccessorKey *)&this_local);
        TVar2.ptr = TStack_58.ptr;
        uVar5 = oldAttributes._7_1_;
        if ((OVar7 != ObjectSlotAttr_Default) && (newAttributes == (ObjectSlotAttributes *)0x0)) {
          uVar6 = TypePath::GetPathSize((TypePath *)TStack_90.ptr);
          oldSetters = UpdateAttributes(this,(Recycler *)TVar2.ptr,(ObjectSlotAttributes *)0x0,uVar5
                                        ,uVar6);
        }
        OVar7 = PathTypeSuccessorKey::GetAttributes((PathTypeSuccessorKey *)&this_local);
        TVar2.ptr = TStack_58.ptr;
        uVar5 = oldAttributes._7_1_;
        if ((OVar7 == ObjectSlotAttr_Setter) && (newSetters == (PathTypeSetterSlotIndex *)0x0)) {
          uVar6 = TypePath::GetPathSize((TypePath *)TStack_90.ptr);
          TStack_b8.ptr =
               (RuntimeFunction *)
               UpdateSetterSlots(this,TVar2.ptr,(PathTypeSetterSlotIndex *)0x0,uVar5,uVar6);
        }
      }
      else {
        pTVar17 = GetTypePath(this);
        TStack_90.ptr = (RuntimeFunction *)TypePath::Grow(pTVar17,TStack_58.ptr);
        OVar7 = PathTypeSuccessorKey::GetAttributes((PathTypeSuccessorKey *)&this_local);
        TVar2.ptr = TStack_58.ptr;
        uVar5 = oldAttributes._7_1_;
        pOVar18 = newAttributes;
        if ((OVar7 != ObjectSlotAttr_Default) || (newAttributes != (ObjectSlotAttributes *)0x0)) {
          uVar6 = TypePath::GetPathSize((TypePath *)TStack_90.ptr);
          oldSetters = UpdateAttributes(this,(Recycler *)TVar2.ptr,pOVar18,uVar5,uVar6);
        }
        OVar7 = PathTypeSuccessorKey::GetAttributes((PathTypeSuccessorKey *)&this_local);
        TVar2.ptr = TStack_58.ptr;
        uVar5 = oldAttributes._7_1_;
        pPVar19 = newSetters;
        if ((OVar7 == ObjectSlotAttr_Setter) || (newSetters != (PathTypeSetterSlotIndex *)0x0)) {
          uVar6 = TypePath::GetPathSize((TypePath *)TStack_90.ptr);
          TStack_b8.ptr = (RuntimeFunction *)UpdateSetterSlots(this,TVar2.ptr,pPVar19,uVar5,uVar6);
        }
        oldTypePath = (TypePath *)this;
        currPredecessorType = (DynamicType *)GetTypePath(this);
        do {
          (*(code *)(oldTypePath->data).ptr[0xf].fixedFields.data[1].word)
                    (oldTypePath,TStack_90.ptr);
          if ((newAttributes != (ObjectSlotAttributes *)0x0) &&
             (pOVar18 = (ObjectSlotAttributes *)
                        (*(code *)(oldTypePath->data).ptr[0xf].usedFixedFields.data[0].word)(),
             pOVar18 == newAttributes)) {
            (**(code **)&(oldTypePath->data).ptr[0xf].maxInitializedLength)(oldTypePath,oldSetters);
          }
          if ((newSetters != (PathTypeSetterSlotIndex *)0x0) &&
             (pPVar19 = (PathTypeSetterSlotIndex *)
                        (**(code **)((oldTypePath->data).ptr[0xf].map.bucketsData + 3))(),
             pPVar19 == newSetters)) {
            (*(code *)(oldTypePath->data).ptr[0x10].usedFixedFields.data[0].word)
                      (oldTypePath,TStack_b8.ptr);
          }
          TStack_e8.ptr = (RuntimeFunction *)GetPredecessorType((PathTypeHandlerBase *)oldTypePath);
          if (TStack_e8.ptr == (RuntimeFunction *)0x0) break;
          pDVar20 = DynamicType::GetTypeHandler((DynamicType *)TStack_e8.ptr);
          iVar13 = (*pDVar20->_vptr_DynamicTypeHandler[0x4e])();
          if (iVar13 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar16 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                        ,0x844,
                                        "(currPredecessorType->GetTypeHandler()->IsPathTypeHandler())"
                                        ,
                                        "currPredecessorType->GetTypeHandler()->IsPathTypeHandler()"
                                       );
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar16 = 0;
          }
          pDVar20 = DynamicType::GetTypeHandler((DynamicType *)TStack_e8.ptr);
          oldTypePath = (TypePath *)FromTypeHandler(pDVar20);
          pDVar23 = (DynamicType *)GetTypePath((PathTypeHandlerBase *)oldTypePath);
        } while (pDVar23 == currPredecessorType);
      }
    }
    else {
      if (newSetters == (PathTypeSetterSlotIndex *)0x0) {
        pTVar17 = GetTypePath(this);
        TVar2.ptr = TStack_58.ptr;
        uVar10 = GetPathLength(this);
        bVar3 = DynamicTypeHandler::GetIsOrMayBecomeShared(&this->super_DynamicTypeHandler);
        local_199 = 0;
        if (bVar3) {
          bVar3 = DynamicTypeHandler::IsolatePrototypes();
          local_199 = bVar3 ^ 0xff;
        }
        TStack_90.ptr =
             (RuntimeFunction *)
             TypePath::Branch<false>
                       (pTVar17,TVar2.ptr,(uint)uVar10,(bool)(local_199 & 1),
                        (ObjectSlotAttributes *)0x0);
      }
      else {
        pTVar17 = GetTypePath(this);
        TVar2.ptr = TStack_58.ptr;
        uVar10 = GetPathLength(this);
        bVar3 = DynamicTypeHandler::GetIsOrMayBecomeShared(&this->super_DynamicTypeHandler);
        local_181 = 0;
        if (bVar3) {
          bVar3 = DynamicTypeHandler::IsolatePrototypes();
          local_181 = bVar3 ^ 0xff;
        }
        TStack_90.ptr =
             (RuntimeFunction *)
             TypePath::Branch<true>
                       (pTVar17,TVar2.ptr,(uint)uVar10,(bool)(local_181 & 1),newAttributes);
      }
      *(int *)((long)&instance_local[0x31].super_RecyclableObject.type.ptr + 4) =
           *(int *)((long)&instance_local[0x31].super_RecyclableObject.type.ptr + 4) + 1;
      *(int *)&instance_local[0x59].super_RecyclableObject.type.ptr =
           *(int *)&instance_local[0x59].super_RecyclableObject.type.ptr + 1;
      OVar7 = PathTypeSuccessorKey::GetAttributes((PathTypeSuccessorKey *)&this_local);
      TVar2.ptr = TStack_58.ptr;
      uVar5 = oldAttributes._7_1_;
      pOVar18 = newAttributes;
      if ((OVar7 != ObjectSlotAttr_Default) || (newAttributes != (ObjectSlotAttributes *)0x0)) {
        uVar6 = TypePath::GetPathSize((TypePath *)TStack_90.ptr);
        oldSetters = UpdateAttributes(this,(Recycler *)TVar2.ptr,pOVar18,uVar5,uVar6);
      }
      OVar7 = PathTypeSuccessorKey::GetAttributes((PathTypeSuccessorKey *)&this_local);
      TVar2.ptr = TStack_58.ptr;
      uVar5 = oldAttributes._7_1_;
      pPVar19 = newSetters;
      if ((OVar7 == ObjectSlotAttr_Setter) || (newSetters != (PathTypeSetterSlotIndex *)0x0)) {
        uVar6 = TypePath::GetPathSize((TypePath *)TStack_90.ptr);
        TStack_b8.ptr = (RuntimeFunction *)UpdateSetterSlots(this,TVar2.ptr,pPVar19,uVar5,uVar6);
      }
      bVar3 = FixPropsOnPathTypes();
      if (bVar3) {
        bVar3 = HasSingletonInstanceOnlyIfNeeded(this);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar16 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                      ,0x816,"(this->HasSingletonInstanceOnlyIfNeeded())",
                                      "this->HasSingletonInstanceOnlyIfNeeded()");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar16 = 0;
        }
        pTVar17 = GetTypePath(this);
        TypePath::ClearSingletonInstanceIfSame(pTVar17,(DynamicObject *)library);
      }
    }
    OVar7 = PathTypeSuccessorKey::GetAttributes((PathTypeSuccessorKey *)&this_local);
    newInlineSlotCapacity._1_1_ = OVar7 == ObjectSlotAttr_Setter;
    if ((bool)newInlineSlotCapacity._1_1_) {
      iVar13 = TypePath::AddInternal<false>((TypePath *)TStack_90.ptr,(PropertyRecord *)nextPath);
      nextType._6_2_ = (PropertyIndex)iVar13;
    }
    else {
      iVar13 = TypePath::AddInternal<true>((TypePath *)TStack_90.ptr,(PropertyRecord *)nextPath);
      nextType._6_2_ = (PropertyIndex)iVar13;
    }
    uVar10 = GetPathLength(this);
    newOffsetOfInlineSlots = uVar10 + 1;
    iVar13 = DynamicTypeHandler::GetSlotCapacity(&this->super_DynamicTypeHandler);
    local_f0 = (unsigned_short)iVar13;
    puVar21 = max<unsigned_short>(&newOffsetOfInlineSlots,&local_f0);
    _newSetterCount = *puVar21;
    local_f2 = DynamicTypeHandler::GetInlineSlotCapacity(&this->super_DynamicTypeHandler);
    local_f4 = DynamicTypeHandler::GetOffsetOfInlineSlots(&this->super_DynamicTypeHandler);
    bVar3 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler(&this->super_DynamicTypeHandler);
    if ((bVar3) &&
       (uVar14 = (uint)_newSetterCount,
       iVar13 = DynamicTypeHandler::GetSlotCapacity(&this->super_DynamicTypeHandler),
       iVar13 < (int)uVar14)) {
      PVar11 = DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
      local_f2 = local_f2 - PVar11;
      local_f4 = 0x20;
    }
    bVar3 = FixPropsOnPathTypes();
    local_235 = 1;
    if (bVar3) {
      local_235 = scriptContext_local._7_1_;
    }
    local_f5 = local_235 & 1;
    OVar7 = PathTypeSuccessorKey::GetAttributes((PathTypeSuccessorKey *)&this_local);
    if ((OVar7 == ObjectSlotAttr_Default) && (newAttributes == (ObjectSlotAttributes *)0x0)) {
      local_80.ptr = (RuntimeFunction *)
                     PathTypeHandlerNoAttr::New
                               ((ScriptContext *)instance_local,TStack_90.ptr,newOffsetOfInlineSlots
                                ,_newSetterCount,local_f2,local_f4,true,(bool)(local_f5 & 1),
                                TStack_30.ptr);
    }
    else {
      iVar13 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x71])();
      local_f6 = (char)iVar13 + (newInlineSlotCapacity._1_1_ & 1);
      OVar7 = PathTypeSuccessorKey::GetAttributes((PathTypeSuccessorKey *)&this_local);
      oldSetters[nextType._6_2_] = OVar7;
      local_80.ptr = (RuntimeFunction *)
                     PathTypeHandlerWithAttr::New
                               ((ScriptContext *)instance_local,TStack_90.ptr,oldSetters,
                                TStack_b8.ptr,local_f6,newOffsetOfInlineSlots,_newSetterCount,
                                local_f2,local_f4,true,(bool)(local_f5 & 1),TStack_30.ptr);
    }
    if ((local_f5 & 1) == 0) {
      DynamicTypeHandler::SetMayBecomeShared((DynamicTypeHandler *)local_80.ptr);
    }
    bVar3 = DynamicTypeHandler::GetHasOnlyWritableDataProperties((DynamicTypeHandler *)local_80.ptr)
    ;
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x87e,"(nextPath->GetHasOnlyWritableDataProperties())",
                                  "nextPath->GetHasOnlyWritableDataProperties()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
    TVar2.ptr = local_80.ptr;
    PVar8 = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
    DynamicTypeHandler::CopyPropertyTypes((DynamicTypeHandler *)TVar2.ptr,0xb0,PVar8);
    TVar2.ptr = local_80.ptr;
    PVar8 = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
    DynamicTypeHandler::SetPropertyTypes((DynamicTypeHandler *)TVar2.ptr,'@',PVar8);
    TVar2.ptr = local_80.ptr;
    if ((scriptContext_local._7_1_ & 1) != 0) {
      PVar12 = PropertyRecord::GetPropertyId((PropertyRecord *)nextPath);
      AddBlankFieldAt((PathTypeHandlerBase *)TVar2.ptr,PVar12,nextType._6_2_,
                      (ScriptContext *)instance_local);
    }
    PVar12 = PathTypeSuccessorKey::GetPropertyId((PathTypeSuccessorKey *)&this_local);
    if (PVar12 == 0x67) {
      (local_80.ptr)->isDisplayString = true;
    }
    PVar12 = PathTypeSuccessorKey::GetPropertyId((PathTypeSuccessorKey *)&this_local);
    BVar15 = IsInternalPropertyId(PVar12);
    if (BVar15 != 0) {
      (local_80.ptr)->field_0x31 = true;
    }
    uVar10 = GetPathLength(this);
    local_fc = uVar10 + 1;
    piVar22 = max<int>(&local_fc,(int *)&instance_local[0x31].auxSlots);
    TVar2.ptr = TStack_58.ptr;
    *(int *)&instance_local[0x31].auxSlots.ptr = *piVar22;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_128,(type_info *)&DynamicType::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
               ,0x89a);
    alloc = Memory::Recycler::TrackAllocInfo((Recycler *)TVar2.ptr,&local_128);
    local_138 = Memory::Recycler::AllocInlined;
    local_130.ptr = (RuntimeFunction *)0x0;
    pDVar23 = (DynamicType *)new<Memory::Recycler>(0x38,alloc,0x43c4b0);
    DynamicType::DynamicType
              (pDVar23,(DynamicType *)TStack_30.ptr,(DynamicTypeHandler *)local_80.ptr,true,
               (bool)(local_f5 & 1));
    TVar2.ptr = TStack_30.ptr;
    PStack_140 = (PathTypeSuccessorKey)this_local;
    nextTypeWeakRef = (RecyclerWeakReference<Js::DynamicType> *)pDVar23;
    typeWeakRef = Memory::Recycler::CreateWeakReferenceHandle<Js::DynamicType>
                            ((Recycler *)TStack_58.ptr,pDVar23);
    SetSuccessor(this,(DynamicType *)TVar2.ptr,PStack_140,typeWeakRef,
                 (ScriptContext *)instance_local);
    uVar10 = GetPathLength((PathTypeHandlerBase *)local_80.ptr);
    bVar4 = TypePath::GetPathLength((TypePath *)TStack_90.ptr);
    if (uVar10 != bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x8aa,
                                  "(nextPath->GetPathLength() == newTypePath->GetPathLength())",
                                  "nextPath->GetPathLength() == newTypePath->GetPathLength()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
    bVar3 = FixPropsOnPathTypes();
    if ((bVar3) && ((scriptContext_local._7_1_ & 1) == 0)) {
      uVar10 = GetPathLength((PathTypeHandlerBase *)local_80.ptr);
      bVar4 = TypePath::GetMaxInitializedLength((TypePath *)TStack_90.ptr);
      if (uVar10 <= bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0x8ac,
                                    "(!FixPropsOnPathTypes() || shareType || nextPath->GetPathLength() > newTypePath->GetMaxInitializedLength())"
                                    ,
                                    "!FixPropsOnPathTypes() || shareType || nextPath->GetPathLength() > newTypePath->GetMaxInitializedLength()"
                                   );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
    }
    TraceFixedFieldsAfterTypeHandlerChange
              ((DynamicObject *)library,&this->super_DynamicTypeHandler,
               (DynamicTypeHandler *)local_80.ptr,(DynamicType *)oldSingletonInstance,
               (DynamicType *)nextTypeWeakRef,
               (RecyclerWeakReference<Js::DynamicObject> *)typeHandlerToUpdate);
    *(int *)((long)&instance_local[0x31].super_RecyclableObject.super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 4) =
         *(int *)((long)&instance_local[0x31].super_RecyclableObject.super_FinalizableObject.
                         super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 4) + 1;
    *(int *)&instance_local[0x59].super_RecyclableObject.super_FinalizableObject.
             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
         *(int *)&instance_local[0x59].super_RecyclableObject.super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 1;
  }
  bVar3 = DynamicTypeHandler::IsolatePrototypes();
  if (((bVar3) &&
      (bVar3 = DynamicTypeHandler::GetIsOrMayBecomeShared(&this->super_DynamicTypeHandler), bVar3))
     && (bVar3 = DynamicTypeHandler::GetIsPrototype(&this->super_DynamicTypeHandler), bVar3)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x8d5,
                                "(!IsolatePrototypes() || !GetIsOrMayBecomeShared() || !GetIsPrototype())"
                                ,
                                "!IsolatePrototypes() || !GetIsOrMayBecomeShared() || !GetIsPrototype()"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 0;
  }
  TVar2.ptr = local_80.ptr;
  values = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler);
  DynamicTypeHandler::SetFlags((DynamicTypeHandler *)TVar2.ptr,' ',values);
  bVar3 = DynamicTypeHandler::GetHasOnlyWritableDataProperties(&this->super_DynamicTypeHandler);
  bVar9 = DynamicTypeHandler::GetHasOnlyWritableDataProperties((DynamicTypeHandler *)local_80.ptr);
  if (((bVar3 != bVar9) &&
      (OVar7 = PathTypeSuccessorKey::GetAttributes((PathTypeSuccessorKey *)&this_local),
      (OVar7 & ObjectSlotAttr_Writable) != ObjectSlotAttr_None)) &&
     (OVar7 = PathTypeSuccessorKey::GetAttributes((PathTypeSuccessorKey *)&this_local),
     (OVar7 & ObjectSlotAttr_Accessor) == ObjectSlotAttr_None)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x8d7,
                                "(this->GetHasOnlyWritableDataProperties() == nextPath->GetHasOnlyWritableDataProperties() || !(key.GetAttributes() & ObjectSlotAttr_Writable) || (key.GetAttributes() & ObjectSlotAttr_Accessor))"
                                ,
                                "this->GetHasOnlyWritableDataProperties() == nextPath->GetHasOnlyWritableDataProperties() || !(key.GetAttributes() & ObjectSlotAttr_Writable) || (key.GetAttributes() & ObjectSlotAttr_Accessor)"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 0;
  }
  bVar3 = DynamicTypeHandler::GetIsInlineSlotCapacityLocked(&this->super_DynamicTypeHandler);
  bVar9 = DynamicTypeHandler::GetIsInlineSlotCapacityLocked((DynamicTypeHandler *)local_80.ptr);
  if (bVar3 != bVar9) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x8d8,
                                "(this->GetIsInlineSlotCapacityLocked() == nextPath->GetIsInlineSlotCapacityLocked())"
                                ,
                                "this->GetIsInlineSlotCapacityLocked() == nextPath->GetIsInlineSlotCapacityLocked()"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 0;
  }
  TVar2.ptr = local_80.ptr;
  PVar8 = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
  DynamicTypeHandler::SetPropertyTypes((DynamicTypeHandler *)TVar2.ptr,0xa0,PVar8);
  OVar7 = PathTypeSuccessorKey::GetAttributes((PathTypeSuccessorKey *)&this_local);
  bVar3 = false;
  if ((OVar7 & ObjectSlotAttr_Writable) != ObjectSlotAttr_None) {
    OVar7 = PathTypeSuccessorKey::GetAttributes((PathTypeSuccessorKey *)&this_local);
    bVar3 = (OVar7 & ObjectSlotAttr_Accessor) == ObjectSlotAttr_None;
  }
  local_141 = '\0';
  if (bVar3) {
    local_141 = '\x04';
  }
  JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache
            ((JavascriptLibrary *)(local_158 + 8));
  this_01 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
            operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)
                       (local_158 + 8));
  PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<Js::PropertyRecord_const*>
            (this_01,(DynamicTypeHandler *)local_80.ptr,local_141,(PropertyRecord *)nextPath,
             (ScriptContext *)instance_local);
  JavascriptLibrary::GetTypesWithNoSpecialPropertyProtoChainCache((JavascriptLibrary *)local_158);
  this_02 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::
            operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *)
                       local_158);
  PrototypeChainCache<Js::NoSpecialPropertyCache>::ProcessProperty<Js::PropertyRecord_const*>
            (this_02,(DynamicTypeHandler *)local_80.ptr,local_141,(PropertyRecord *)nextPath,
             (ScriptContext *)instance_local);
  *propertyIndex = nextType._6_2_;
  pDVar23 = GetPredecessorType((PathTypeHandlerBase *)local_80.ptr);
  pPVar24 = (PathTypeHandlerBase *)DynamicType::GetTypeHandler(pDVar23);
  if (pPVar24 != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x8e2,"(nextPath->GetPredecessorType()->GetTypeHandler() == this)",
                                "Promoting this type to a successor with a different predecessor?");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 0;
  }
  return (DynamicType *)nextTypeWeakRef;
}

Assistant:

DynamicType* PathTypeHandlerBase::PromoteType(DynamicType* predecessorType, const PathTypeSuccessorKey key, bool shareType, ScriptContext* scriptContext, DynamicObject* instance, PropertyIndex* propertyIndex)
    {
        Assert(propertyIndex != nullptr);
        Assert(isObjectLiteral || instance != nullptr);

        JavascriptLibrary* library = scriptContext->GetLibrary();
        Recycler* recycler = scriptContext->GetRecycler();
        PropertyIndex index;
        DynamicType * nextType;
        RecyclerWeakReference<DynamicType>* nextTypeWeakRef = nullptr;
        const PropertyRecord *propertyRecord = scriptContext->GetPropertyName(key.GetPropertyId());

        PathTypeHandlerBase * nextPath;
        if (!GetSuccessor(key, &nextTypeWeakRef) || (nextType = nextTypeWeakRef->Get()) == nullptr)
        {
            TypePath * newTypePath = GetTypePath();
            uint8 oldPathSize = GetTypePath()->GetPathSize();

            ObjectSlotAttributes *oldAttributes = GetAttributeArray();
            ObjectSlotAttributes *newAttributes = oldAttributes;
            PathTypeSetterSlotIndex *oldSetters = GetSetterSlots();
            PathTypeSetterSlotIndex *newSetters = oldSetters;

            bool branching = GetTypePath()->GetPathLength() > GetPathLength();
            bool growing = !branching && GetTypePath()->GetPathLength() == GetTypePath()->GetPathSize();

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            DynamicType* oldType = predecessorType;
            RecyclerWeakReference<DynamicObject>* oldSingletonInstance = GetSingletonInstance();
            TraceFixedFieldsBeforeTypeHandlerChange(branching ? _u("branching") : _u("advancing"), _u("PathTypeHandler"), _u("PathTypeHandler"), instance, this, oldType, oldSingletonInstance);
#endif
#endif

            if (branching)
            {
                // We need to branch the type path.

                if (oldSetters)
                {
                    newTypePath = GetTypePath()->Branch<true>(recycler, GetPathLength(), GetIsOrMayBecomeShared() && !IsolatePrototypes(), oldAttributes);
                }
                else
                {
                    newTypePath = GetTypePath()->Branch<false>(recycler, GetPathLength(), GetIsOrMayBecomeShared() && !IsolatePrototypes());
                }

#ifdef PROFILE_TYPES
                scriptContext->branchCount++;
#endif
#ifdef PROFILE_OBJECT_LITERALS
                if (isObjectLiteral)
                {
                    scriptContext->objectLiteralBranchCount++;
                }
#endif

                if (key.GetAttributes() != ObjectSlotAttr_Default || oldAttributes != nullptr)
                {
                    newAttributes = this->UpdateAttributes(recycler, oldAttributes, oldPathSize, newTypePath->GetPathSize());
                }

                if ((key.GetAttributes() == ObjectSlotAttr_Setter) || oldSetters != nullptr)
                {
                    newSetters = this->UpdateSetterSlots(recycler, oldSetters, oldPathSize, newTypePath->GetPathSize());
                }

#if ENABLE_FIXED_FIELDS
#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
                if (PathTypeHandlerBase::FixPropsOnPathTypes())
                {
                    Assert(this->HasSingletonInstanceOnlyIfNeeded());
                    this->GetTypePath()->ClearSingletonInstanceIfSame(instance);
                }
#endif
#endif
            }
            else if (growing)
            {
                // We need to grow the type path.

                newTypePath = GetTypePath()->Grow(recycler);

                if (key.GetAttributes() != ObjectSlotAttr_Default || oldAttributes != nullptr)
                {
                    newAttributes = this->UpdateAttributes(recycler, oldAttributes, oldPathSize, newTypePath->GetPathSize());
                }

                if ((key.GetAttributes() == ObjectSlotAttr_Setter) || oldSetters != nullptr)
                {
                    newSetters = this->UpdateSetterSlots(recycler, oldSetters, oldPathSize, newTypePath->GetPathSize());
                }

                // Update all the predecessor types that use this TypePath to the new TypePath.
                // This will allow the old TypePath to be collected, and will ensure that the
                // fixed field info is correct for those types.

                PathTypeHandlerBase * typeHandlerToUpdate = this;
                TypePath * oldTypePath = GetTypePath();
                while (true)
                {
                    typeHandlerToUpdate->SetTypePath(newTypePath);
                    if (oldAttributes && typeHandlerToUpdate->GetAttributeArray() == oldAttributes)
                    {
                        typeHandlerToUpdate->SetAttributeArray(newAttributes);
                    }
                    if (oldSetters && typeHandlerToUpdate->GetSetterSlots() == oldSetters)
                    {
                        typeHandlerToUpdate->SetSetterSlots(newSetters);
                    }

                    DynamicType * currPredecessorType = typeHandlerToUpdate->GetPredecessorType();
                    if (currPredecessorType == nullptr)
                    {
                        break;
                    }

                    Assert(currPredecessorType->GetTypeHandler()->IsPathTypeHandler());
                    typeHandlerToUpdate = PathTypeHandlerBase::FromTypeHandler(currPredecessorType->GetTypeHandler());
                    if (typeHandlerToUpdate->GetTypePath() != oldTypePath)
                    {
                        break;
                    }
                }
            }
            else
            {
                if (key.GetAttributes() != ObjectSlotAttr_Default && oldAttributes == nullptr)
                {
                    newAttributes = this->UpdateAttributes(recycler, nullptr, oldPathSize, newTypePath->GetPathSize());
                }

                if ((key.GetAttributes() == ObjectSlotAttr_Setter) && oldSetters == nullptr)
                {
                    newSetters = this->UpdateSetterSlots(recycler, nullptr, oldPathSize, newTypePath->GetPathSize());
                }
            }

            bool isSetterProperty = key.GetAttributes() == ObjectSlotAttr_Setter;
            if (isSetterProperty)
            {
                // Not actually adding a property ID to the type path map here.
                index = (PropertyIndex)newTypePath->AddInternal<false>(propertyRecord);
            }
            else
            {
                index = (PropertyIndex)newTypePath->AddInternal<true>(propertyRecord);
            }

            const PropertyIndex newPropertyCount = GetPathLength() + 1;
            const PropertyIndex newSlotCapacity = max(newPropertyCount, static_cast<PropertyIndex>(GetSlotCapacity()));
            PropertyIndex newInlineSlotCapacity = GetInlineSlotCapacity();
            uint16 newOffsetOfInlineSlots = GetOffsetOfInlineSlots();
            if(IsObjectHeaderInlinedTypeHandler() && newSlotCapacity > GetSlotCapacity())
            {
                newInlineSlotCapacity -= GetObjectHeaderInlinableSlotCapacity();
                newOffsetOfInlineSlots = sizeof(DynamicObject);
            }
#if ENABLE_FIXED_FIELDS
            bool markTypeAsShared = !FixPropsOnPathTypes() || shareType;
#else
            bool markTypeAsShared = true;
#endif

            if (key.GetAttributes() == ObjectSlotAttr_Default && oldAttributes == nullptr)
            {
                nextPath = PathTypeHandlerNoAttr::New(scriptContext, newTypePath, newPropertyCount, newSlotCapacity, newInlineSlotCapacity, newOffsetOfInlineSlots, true, markTypeAsShared, predecessorType);
            }
            else
            {
                PathTypeSetterSlotIndex newSetterCount = GetSetterCount() + isSetterProperty;
                newAttributes[index] = key.GetAttributes();
                nextPath = PathTypeHandlerWithAttr::New(scriptContext, newTypePath, newAttributes, newSetters, newSetterCount, newPropertyCount, newSlotCapacity, newInlineSlotCapacity, newOffsetOfInlineSlots, true, markTypeAsShared, predecessorType);
            }
            if (!markTypeAsShared) nextPath->SetMayBecomeShared();
            Assert(nextPath->GetHasOnlyWritableDataProperties());
            nextPath->CopyPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, GetPropertyTypes());
            nextPath->SetPropertyTypes(PropertyTypesInlineSlotCapacityLocked, GetPropertyTypes());

#if ENABLE_FIXED_FIELDS
            if (shareType)
            {
                nextPath->AddBlankFieldAt(propertyRecord->GetPropertyId(), index, scriptContext);
            }
#endif

            if (key.GetPropertyId() == PropertyIds::constructor)
            {
                nextPath->hasUserDefinedCtor = true;
            }

            if (IsInternalPropertyId(key.GetPropertyId()))
            {
                nextPath->hasInternalProperty = true;
            }

#ifdef PROFILE_TYPES
            scriptContext->maxPathLength = max(GetPathLength() + 1, scriptContext->maxPathLength);
#endif

            if (isObjectLiteral)
            {
                // The new type isn't shared yet.  We will make it shared when the second instance attains it.
                nextType = RecyclerNew(recycler, DynamicType, predecessorType, nextPath, /* isLocked = */ true, /* isShared = */ markTypeAsShared);
            }
            else
            {
                // The new type isn't shared yet.  We will make it shared when the second instance attains it.
                nextType = instance->DuplicateType();
                // nextType's prototype and predecessorType's prototype can only be different here
                // only for SetPrototype scenario where predecessorType is the cachedType with newPrototype
                nextType->SetPrototype(predecessorType->GetPrototype());
                nextType->typeHandler = nextPath;
                markTypeAsShared ? nextType->SetIsLockedAndShared() : nextType->SetIsLocked();
            }

            SetSuccessor(predecessorType, key, recycler->CreateWeakReferenceHandle<DynamicType>(nextType), scriptContext);
            // We just extended the current type path to a new tip or created a brand new type path.  We should
            // be at the tip of the path and there should be no instances there yet.
            Assert(nextPath->GetPathLength() == newTypePath->GetPathLength());
#if ENABLE_FIXED_FIELDS
            Assert(!FixPropsOnPathTypes() || shareType || nextPath->GetPathLength() > newTypePath->GetMaxInitializedLength());
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            TraceFixedFieldsAfterTypeHandlerChange(instance, this, nextPath, oldType, nextType, oldSingletonInstance);
#endif
#endif
#ifdef PROFILE_TYPES
            scriptContext->promoteCount++;
#endif
#ifdef PROFILE_OBJECT_LITERALS
            if (isObjectLiteral)
            {
                scriptContext->objectLiteralPromoteCount++;
            }
#endif
        }
        else
        {
#ifdef PROFILE_TYPES
            scriptContext->cacheCount++;
#endif

            // Now that the second (or subsequent) instance reached this type, make sure that it's shared.
            nextPath = (PathTypeHandlerBase *)nextType->GetTypeHandler();
            Assert(nextPath->GetIsInlineSlotCapacityLocked() == this->GetIsInlineSlotCapacityLocked());

            index = nextPath->GetPropertyIndex(propertyRecord);

#if ENABLE_FIXED_FIELDS
            Assert((FixPropsOnPathTypes() && nextPath->GetMayBecomeShared()) || (nextPath->GetIsShared() && nextType->GetIsShared()));
            if (FixPropsOnPathTypes() && !nextType->GetIsShared())
            {
                if (!nextPath->GetIsShared())
                {
                    nextPath->AddBlankFieldAt(propertyRecord->GetPropertyId(), index, scriptContext);
                    nextPath->DoShareTypeHandlerInternal<true>(scriptContext);
                }
                nextType->ShareType();
            }
#endif
        }

        Assert(!IsolatePrototypes() || !GetIsOrMayBecomeShared() || !GetIsPrototype());
        nextPath->SetFlags(IsPrototypeFlag, this->GetFlags());
        Assert(this->GetHasOnlyWritableDataProperties() == nextPath->GetHasOnlyWritableDataProperties() || !(key.GetAttributes() & ObjectSlotAttr_Writable) || (key.GetAttributes() & ObjectSlotAttr_Accessor));
        Assert(this->GetIsInlineSlotCapacityLocked() == nextPath->GetIsInlineSlotCapacityLocked());
        nextPath->SetPropertyTypes(PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, this->GetPropertyTypes());

        PropertyAttributes isWritableAttribute = ((key.GetAttributes() & ObjectSlotAttr_Writable) && !(key.GetAttributes() & ObjectSlotAttr_Accessor)) ? PropertyWritable : PropertyNone;
        library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(nextPath, isWritableAttribute, propertyRecord, scriptContext);
        library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(nextPath, isWritableAttribute, propertyRecord, scriptContext);

        (*propertyIndex) = index;

#if DBG
        AssertMsg(nextPath->GetPredecessorType()->GetTypeHandler() == this, "Promoting this type to a successor with a different predecessor?");
#endif

        return nextType;
    }